

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_FormatDec_Test::TestBody(FormatterTest_FormatDec_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_7;
  char buffer [256];
  undefined8 local_388;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  internal local_378 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  undefined1 *local_338;
  long lStack_330;
  undefined8 local_328;
  undefined1 local_320 [504];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [8];
  
  local_368._M_dataplus._M_p = (pointer)0x0;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str.size_ = 3;
  format_str.data_ = "{0}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str,args,(locale_ref)0x0);
  paVar1 = &local_128[0].field_2;
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_388,"\"0\"","format(\"{0}\", 0)",(char (*) [2])0x251ba6,local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x555,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = &DAT_0000002a;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_00.size_ = 3;
  format_str_00.data_ = "{0}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_00,args_00,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_388,"\"42\"","format(\"{0}\", 42)",(char (*) [3])0x248e7f,local_128)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x556,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = &DAT_0000002a;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_01.size_ = 5;
  format_str_01.data_ = "{0:d}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_01,args_01,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_388,"\"42\"","format(\"{0:d}\", 42)",(char (*) [3])0x248e7f,
             local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x557,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = &DAT_0000002a;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_02.size_ = 3;
  format_str_02.data_ = "{0}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_02,args_02,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_388,"\"42\"","format(\"{0}\", 42u)",(char (*) [3])0x248e7f,local_128
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x558,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = &DAT_ffffffd6;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_03.size_ = 3;
  format_str_03.data_ = "{0}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_03,args_03,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_388,"\"-42\"","format(\"{0}\", -42)",(char (*) [4])0x2417f2,
             local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x559,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = (pointer)0x3039;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_04.size_ = 3;
  format_str_04.data_ = "{0}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_04,args_04,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_388,"\"12345\"","format(\"{0}\", 12345)",(char (*) [6])"12345",
             local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = (pointer)0x10932;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_05.size_ = 3;
  format_str_05.data_ = "{0}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_368;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_05,args_05,(locale_ref)0x0);
  local_128[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_388,"\"67890\"","format(\"{0}\", 67890)",(char (*) [6])"67890",
             local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_128[0]._M_dataplus._M_p);
  }
  if (local_388._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%d",0x80000000);
  local_388 = 0x80000000;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_06.size_ = 3;
  format_str_06.data_ = "{0}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_06,args_06,(locale_ref)0x0);
  paVar1 = &local_368.field_2;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", (-2147483647 -1))",(char (*) [256])local_128,
             &local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%d",0x7fffffff);
  local_388 = 0x7fffffff;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_07.size_ = 3;
  format_str_07.data_ = "{0}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_07,args_07,(locale_ref)0x0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", 2147483647)",(char (*) [256])local_128,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x560,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%u",0xffffffff);
  local_388 = 0xffffffff;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_08.size_ = 3;
  format_str_08.data_ = "{0}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_08,args_08,(locale_ref)0x0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", (2147483647 *2U +1U))",(char (*) [256])local_128,
             &local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x562,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%ld",0x8000000000000000);
  local_388 = 0x8000000000000000;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_09.size_ = 3;
  format_str_09.data_ = "{0}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_09,args_09,(locale_ref)0x0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", (-9223372036854775807L -1L))",
             (char (*) [256])local_128,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x564,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%ld",0x7fffffffffffffff);
  local_388 = 0x7fffffffffffffff;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_10.size_ = 3;
  format_str_10.data_ = "{0}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_10,args_10,(locale_ref)0x0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", 9223372036854775807L)",(char (*) [256])local_128,
             &local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x566,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_128,"%lu",0xffffffffffffffff);
  local_388 = 0xffffffffffffffff;
  lStack_330 = 0;
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_328 = 500;
  format_str_11.size_ = 3;
  format_str_11.data_ = "{0}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_388;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_338 = local_320;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_340,format_str_11,args_11,(locale_ref)0x0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,local_338,local_338 + lStack_330);
  local_340.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_338 != local_320) {
    operator_delete(local_338);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_378,"buffer","format(\"{0}\", (9223372036854775807L *2UL+1UL))",
             (char (*) [256])local_128,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_340);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x568,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_340.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_340.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_340.ptr_ + 8))();
      }
      local_340.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, FormatDec) {
  EXPECT_EQ("0", format("{0}", 0));
  EXPECT_EQ("42", format("{0}", 42));
  EXPECT_EQ("42", format("{0:d}", 42));
  EXPECT_EQ("42", format("{0}", 42u));
  EXPECT_EQ("-42", format("{0}", -42));
  EXPECT_EQ("12345", format("{0}", 12345));
  EXPECT_EQ("67890", format("{0}", 67890));
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%d", INT_MIN);
  EXPECT_EQ(buffer, format("{0}", INT_MIN));
  safe_sprintf(buffer, "%d", INT_MAX);
  EXPECT_EQ(buffer, format("{0}", INT_MAX));
  safe_sprintf(buffer, "%u", UINT_MAX);
  EXPECT_EQ(buffer, format("{0}", UINT_MAX));
  safe_sprintf(buffer, "%ld", 0 - static_cast<unsigned long>(LONG_MIN));
  EXPECT_EQ(buffer, format("{0}", LONG_MIN));
  safe_sprintf(buffer, "%ld", LONG_MAX);
  EXPECT_EQ(buffer, format("{0}", LONG_MAX));
  safe_sprintf(buffer, "%lu", ULONG_MAX);
  EXPECT_EQ(buffer, format("{0}", ULONG_MAX));
}